

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cpp
# Opt level: O2

void __thiscall CFlow::Add(CFlow *this,vec2 Pos,vec2 Vel,float Size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CCell *pCVar3;
  undefined1 auVar4 [16];
  undefined4 in_ECX;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar10;
  CCell CVar8;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  auVar9._8_8_ = in_XMM0_Qb;
  auVar9._0_8_ = Pos;
  pCVar3 = this->m_pCells;
  if (pCVar3 != (CCell *)0x0) {
    auVar11._0_4_ = (float)this->m_Spacing;
    auVar11._4_4_ = auVar11._0_4_;
    auVar11._8_4_ = auVar11._0_4_;
    auVar11._12_4_ = auVar11._0_4_;
    auVar9 = divps(auVar9,auVar11);
    iVar7 = (int)auVar9._0_4_;
    iVar10 = (int)auVar9._4_4_;
    auVar12._4_4_ = iVar10;
    auVar12._0_4_ = iVar10;
    auVar12._8_4_ = iVar7;
    auVar12._12_4_ = iVar7;
    iVar5 = movmskpd(in_ECX,auVar12);
    if (iVar5 == 0) {
      uVar1 = this->m_Height;
      uVar2 = this->m_Width;
      auVar4._4_4_ = -(uint)(iVar10 < (int)uVar1);
      auVar4._0_4_ = -(uint)(iVar10 < (int)uVar1);
      auVar4._8_4_ = -(uint)(iVar7 < (int)uVar2);
      auVar4._12_4_ = -(uint)(iVar7 < (int)uVar2);
      iVar5 = movmskpd(0,auVar4);
      if (iVar5 == 3) {
        uVar6 = iVar7 + iVar10 * uVar2;
        CVar8.m_Vel.field_0.x = pCVar3[uVar6].m_Vel.field_0.x + Vel.field_0.x;
        CVar8.m_Vel.field_1.y = pCVar3[uVar6].m_Vel.field_1.y + Vel.field_1.y;
        pCVar3[uVar6].m_Vel = CVar8.m_Vel;
      }
    }
  }
  return;
}

Assistant:

void CFlow::Add(vec2 Pos, vec2 Vel, float Size)
{
	if(!m_pCells)
		return;

	int x = (int)(Pos.x / m_Spacing);
	int y = (int)(Pos.y / m_Spacing);
	if(x < 0 || y < 0 || x >= m_Width || y >= m_Height)
		return;

	m_pCells[y*m_Width+x].m_Vel += Vel;
}